

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O2

void mean_double_2_suite::test_two(void)

{
  value_type local_70 [2];
  moment<double,_2> filter;
  
  filter.member.window.super_span<double,_2UL>.member.size = 0;
  filter.member.window.super_span<double,_2UL>.member.next = 2;
  filter.member.mean = 0.0;
  filter.member.window.super_span<double,_2UL>.member.data = (pointer)&filter;
  trial::online::window::basic_moment<double,_2UL,_(trial::online::with)1>::push(&filter,1.0);
  local_70[0] = filter.member.mean;
  local_70[1] = 1.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x6a,"void mean_double_2_suite::test_two()",local_70,local_70 + 1);
  trial::online::window::basic_moment<double,_2UL,_(trial::online::with)1>::push(&filter,3.0);
  local_70[0] = filter.member.mean;
  local_70[1] = 2.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","2.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x6c,"void mean_double_2_suite::test_two()",local_70,local_70 + 1);
  return;
}

Assistant:

void test_two()
{
    window::moment<double, 2> filter;
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    filter.push(3.0);
    TRIAL_TEST_EQ(filter.mean(), 2.0);
}